

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O2

uint8_t * IpmiFruAddString(uint8_t *pos,char *str)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uint8_t *__dest;
  
  sVar4 = strlen(str);
  iVar2 = (int)sVar4;
  iVar1 = 0x3f;
  if (iVar2 < 0x3f) {
    iVar1 = iVar2;
  }
  iVar3 = 2;
  if (iVar2 != 1) {
    iVar3 = iVar1;
  }
  *pos = (char)iVar3 + 0xc0;
  __dest = pos + 1;
  if (iVar3 != 0) {
    memcpy(__dest,str,(long)iVar3);
    __dest = __dest + iVar3;
  }
  return __dest;
}

Assistant:

uint8_t *IpmiFruAddString(uint8_t *pos, const char *str)
{
    int len = strlen(str);
    if (len == 1) {
        len ++;
    } else if (len > 63) {
        len = 63;
    }
    *pos++ = 0xC0 + len;
    if (len) {
        memcpy(pos, str, len);
        pos += len;
    }
    return pos;
}